

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  float _y;
  ImGuiColumnsSet *columns_00;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  value_type *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiCol local_8c;
  int local_80;
  float x_1;
  int n_1;
  ImVec2 local_74;
  float local_6c;
  ImU32 local_68;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_58;
  undefined1 local_50 [8];
  ImRect column_rect;
  float column_hw;
  ImGuiID column_id;
  float x;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiColumnsSet *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  columns_00 = (pIVar3->DC).ColumnsSet;
  if (columns_00 == (ImGuiColumnsSet *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3293,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar3->DrawList);
  fVar5 = ImMax<float>(columns_00->LineMaxY,(pIVar3->DC).CursorPos.y);
  columns_00->LineMaxY = fVar5;
  (pIVar3->DC).CursorPos.y = columns_00->LineMaxY;
  if ((columns_00->Flags & 0x10U) == 0) {
    (pIVar3->DC).CursorMaxPos.x = columns_00->StartMaxPosX;
  }
  y2._3_1_ = false;
  if (((columns_00->Flags & 1U) == 0) && ((pIVar3->SkipItems & 1U) == 0)) {
    fVar5 = columns_00->StartPosY;
    _y = (pIVar3->DC).CursorPos.y;
    x = -NAN;
    for (column_id = 1; (int)column_id < columns_00->Count; column_id = column_id + 1) {
      fVar7 = (pIVar3->Pos).x;
      fVar6 = GetColumnOffset(column_id);
      fVar7 = fVar7 + fVar6;
      column_rect.Max.y = (float)(columns_00->ID + column_id);
      column_rect.Max.x = GetColumnsRectHalfWidth();
      ImVec2::ImVec2(&local_58,fVar7 - column_rect.Max.x,fVar5);
      ImVec2::ImVec2((ImVec2 *)&col,fVar7 + column_rect.Max.x,_y);
      ImRect::ImRect((ImRect *)local_50,&local_58,(ImVec2 *)&col);
      KeepAliveID((ImGuiID)column_rect.Max.y);
      bVar2 = IsClippedEx((ImRect *)local_50,(ImGuiID)column_rect.Max.y,false);
      if (!bVar2) {
        xi._3_1_ = 0;
        xi._2_1_ = 0;
        if ((columns_00->Flags & 2U) == 0) {
          ButtonBehavior((ImRect *)local_50,(ImGuiID)column_rect.Max.y,(bool *)((long)&xi + 3),
                         (bool *)((long)&xi + 2),0);
          if (((xi._3_1_ & 1) != 0) || ((xi._2_1_ & 1) != 0)) {
            pIVar1->MouseCursor = 4;
          }
          if (((xi._2_1_ & 1) != 0) &&
             (pvVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,column_id),
             (pvVar4->Flags & 2U) == 0)) {
            x = (float)column_id;
          }
        }
        if ((xi._2_1_ & 1) == 0) {
          local_8c = 0x1b;
          if ((xi._3_1_ & 1) != 0) {
            local_8c = 0x1c;
          }
        }
        else {
          local_8c = 0x1d;
        }
        local_68 = GetColorU32(local_8c,1.0);
        this = pIVar3->DrawList;
        local_6c = (float)(int)fVar7;
        fVar6 = ImMax<float>(fVar5 + 1.0,(pIVar3->ClipRect).Min.y);
        ImVec2::ImVec2(&local_74,(float)(int)fVar7,fVar6);
        fVar7 = local_6c;
        fVar6 = ImMin<float>(_y,(pIVar3->ClipRect).Max.y);
        ImVec2::ImVec2((ImVec2 *)&x_1,fVar7,fVar6);
        ImDrawList::AddLine(this,&local_74,(ImVec2 *)&x_1,local_68,1.0);
      }
    }
    if (x != -NAN) {
      if ((columns_00->IsBeingResized & 1U) == 0) {
        for (local_80 = 0; local_80 < columns_00->Count + 1; local_80 = local_80 + 1) {
          pvVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_80);
          fVar5 = pvVar4->OffsetNorm;
          pvVar4 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_80);
          pvVar4->OffsetNormBeforeResize = fVar5;
        }
      }
      y2._3_1_ = true;
      columns_00->IsBeingResized = true;
      fVar5 = GetDraggedColumnOffset(columns_00,(int)x);
      SetColumnOffset((int)x,fVar5);
    }
  }
  columns_00->IsBeingResized = y2._3_1_;
  (pIVar3->DC).ColumnsSet = (ImGuiColumnsSet *)0x0;
  (pIVar3->DC).ColumnsOffsetX = 0.0;
  (pIVar3->DC).CursorPos.x =
       (float)(int)((pIVar3->Pos).x + (pIVar3->DC).IndentX + (pIVar3->DC).ColumnsOffsetX);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->StartMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = columns->StartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hw = GetColumnsRectHalfWidth(); // Half-width for interaction
            const ImRect column_rect(ImVec2(x - column_hw, y1), ImVec2(x + column_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(columns->Columns[n].Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column (we clip the Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.)
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, ImMax(y1 + 1.0f, window->ClipRect.Min.y)), ImVec2(xi, ImMin(y2, window->ClipRect.Max.y)), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.ColumnsSet = NULL;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}